

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::CustomOptions_MessageOptionThreeFieldsSet_Test::TestBody
          (CustomOptions_MessageOptionThreeFieldsSet_Test *this)

{
  bool bVar1;
  Descriptor *pDVar2;
  FileDescriptor *pFVar3;
  char *pcVar4;
  ConstType this_00;
  Message *in_RCX;
  char *in_R9;
  string_view input;
  AssertHelper local_560;
  Message local_558;
  int32_t local_550;
  int local_54c;
  undefined1 local_548 [8];
  AssertionResult gtest_ar_1;
  MessageOptions *options;
  Message local_528;
  int local_520 [2];
  undefined1 local_518 [8];
  AssertionResult gtest_ar;
  AssertHelper local_4e8;
  Message local_4e0;
  bool local_4d1;
  undefined1 local_4d0 [8];
  AssertionResult gtest_ar__4;
  FileDescriptor *file;
  AssertHelper local_498;
  Message local_490;
  basic_string_view<char,_std::char_traits<char>_> local_488;
  bool local_471;
  undefined1 local_470 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_440;
  Message local_438;
  bool local_429;
  undefined1 local_428 [8];
  AssertionResult gtest_ar__2;
  FileDescriptorProto file_proto;
  AssertHelper local_300;
  Message local_2f8;
  bool local_2e9;
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar__1;
  FileDescriptorProto any_proto;
  string local_1d8;
  AssertHelper local_1b8;
  Message local_1b0;
  bool local_1a1;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar_;
  undefined1 local_180 [8];
  FileDescriptorProto file_proto_1;
  DescriptorPool pool;
  CustomOptions_MessageOptionThreeFieldsSet_Test *this_local;
  
  DescriptorPool::DescriptorPool((DescriptorPool *)((long)&file_proto_1.field_0 + 0xe0));
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_180);
  pDVar2 = FileDescriptorProto::descriptor();
  pFVar3 = Descriptor::file(pDVar2);
  FileDescriptor::CopyTo(pFVar3,(FileDescriptorProto *)local_180);
  pFVar3 = DescriptorPool::BuildFile
                     ((DescriptorPool *)((long)&file_proto_1.field_0 + 0xe0),
                      (FileDescriptorProto *)local_180);
  local_1a1 = pFVar3 != (FileDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1a0,&local_1a1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
  if (!bVar1) {
    testing::Message::Message(&local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1d8,(internal *)local_1a0,
               (AssertionResult *)"pool.BuildFile(file_proto) != nullptr","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    in_RCX = (Message *)0xff0;
    testing::internal::AssertHelper::AssertHelper
              (&local_1b8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0xff0,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_1b8);
    std::__cxx11::string::~string((string *)&local_1d8);
    testing::Message::~Message(&local_1b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_180);
  if (bVar1) {
    FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)&gtest_ar__1.message_);
    pDVar2 = Any::descriptor();
    pFVar3 = Descriptor::file(pDVar2);
    FileDescriptor::CopyTo(pFVar3,(FileDescriptorProto *)&gtest_ar__1.message_);
    pFVar3 = DescriptorPool::BuildFile
                       ((DescriptorPool *)((long)&file_proto_1.field_0 + 0xe0),
                        (FileDescriptorProto *)&gtest_ar__1.message_);
    local_2e9 = pFVar3 != (FileDescriptor *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_2e8,&local_2e9,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
    if (!bVar1) {
      testing::Message::Message(&local_2f8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)((long)&file_proto.field_0 + 0xe0),(internal *)local_2e8,
                 (AssertionResult *)"pool.BuildFile(any_proto) != nullptr","false","true",in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      in_RCX = (Message *)0xff5;
      testing::internal::AssertHelper::AssertHelper
                (&local_300,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0xff5,pcVar4);
      testing::internal::AssertHelper::operator=(&local_300,&local_2f8);
      testing::internal::AssertHelper::~AssertHelper(&local_300);
      std::__cxx11::string::~string((string *)((long)&file_proto.field_0 + 0xe0));
      testing::Message::~Message(&local_2f8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
    FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&gtest_ar__1.message_);
    if (bVar1) {
      FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)&gtest_ar__2.message_);
      pDVar2 = proto2_unittest::TestMessageWithCustomOptions::descriptor();
      pFVar3 = Descriptor::file(pDVar2);
      FileDescriptor::CopyTo(pFVar3,(FileDescriptorProto *)&gtest_ar__2.message_);
      pFVar3 = DescriptorPool::BuildFile
                         ((DescriptorPool *)((long)&file_proto_1.field_0 + 0xe0),
                          (FileDescriptorProto *)&gtest_ar__2.message_);
      local_429 = pFVar3 != (FileDescriptor *)0x0;
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_428,&local_429,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_428);
      if (!bVar1) {
        testing::Message::Message(&local_438);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__3.message_,(internal *)local_428,
                   (AssertionResult *)"pool.BuildFile(file_proto) != nullptr","false","true",in_R9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        in_RCX = (Message *)0xffa;
        testing::internal::AssertHelper::AssertHelper
                  (&local_440,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0xffa,pcVar4);
        testing::internal::AssertHelper::operator=(&local_440,&local_438);
        testing::internal::AssertHelper::~AssertHelper(&local_440);
        std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_438);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_428);
      if (bVar1) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_488,
                   "name: \"custom_options_import.proto\" package: \"proto2_unittest\" dependency: \"google/protobuf/unittest_custom_options.proto\" message_type {   name: \"Foo\"   options {     uninterpreted_option {       name {         name_part: \"complex_opt1\"         is_extension: true       }       name {         name_part: \"foo\"         is_extension: false       }       positive_int_value: 1234     }     uninterpreted_option {       name {         name_part: \"complex_opt1\"         is_extension: true       }       name {         name_part: \"foo2\"         is_extension: false       }       positive_int_value: 1234     }     uninterpreted_option {       name {         name_part: \"complex_opt1\"         is_extension: true       }       name {         name_part: \"foo3\"         is_extension: false       }       positive_int_value: 1234     }   } }"
                  );
        input._M_str = (char *)&gtest_ar__2.message_;
        input._M_len = (size_t)local_488._M_str;
        local_471 = TextFormat::ParseFromString((TextFormat *)local_488._M_len,input,in_RCX);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_470,&local_471,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_470);
        if (!bVar1) {
          testing::Message::Message(&local_490);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&file,(internal *)local_470,
                     (AssertionResult *)
                     "TextFormat::ParseFromString( \"name: \\\"custom_options_import.proto\\\" \" \"package: \\\"proto2_unittest\\\" \" \"dependency: \\\"google/protobuf/unittest_custom_options.proto\\\" \" \"message_type { \" \"  name: \\\"Foo\\\" \" \"  options { \" \"    uninterpreted_option { \" \"      name { \" \"        name_part: \\\"complex_opt1\\\" \" \"        is_extension: true \" \"      } \" \"      name { \" \"        name_part: \\\"foo\\\" \" \"        is_extension: false \" \"      } \" \"      positive_int_value: 1234 \" \"    } \" \"    uninterpreted_option { \" \"      name { \" \"        name_part: \\\"complex_opt1\\\" \" \"        is_extension: true \" \"      } \" \"      name { \" \"        name_part: \\\"foo2\\\" \" \"        is_extension: false \" \"      } \" \"      positive_int_value: 1234 \" \"    } \" \"    uninterpreted_option { \" \"      name { \" \"        name_part: \\\"complex_opt1\\\" \" \"        is_extension: true \" \"      } \" \"      name { \" \"        name_part: \\\"foo3\\\" \" \"        is_extension: false \" \"      } \" \"      positive_int_value: 1234 \" \"    } \" \"  } \" \"}\", &file_proto)"
                     ,"false","true",in_R9);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_498,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0x102f,pcVar4);
          testing::internal::AssertHelper::operator=(&local_498,&local_490);
          testing::internal::AssertHelper::~AssertHelper(&local_498);
          std::__cxx11::string::~string((string *)&file);
          testing::Message::~Message(&local_490);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_470);
        if (bVar1) {
          gtest_ar__4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )DescriptorPool::BuildFile
                           ((DescriptorPool *)((long)&file_proto_1.field_0 + 0xe0),
                            (FileDescriptorProto *)&gtest_ar__2.message_);
          local_4d1 = (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )gtest_ar__4.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl !=
                      (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       )0x0;
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_4d0,&local_4d1,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d0);
          if (!bVar1) {
            testing::Message::Message(&local_4e0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar.message_,(internal *)local_4d0,
                       (AssertionResult *)0x1d2399f,"false","true",in_R9);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_4e8,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                       ,0x1032,pcVar4);
            testing::internal::AssertHelper::operator=(&local_4e8,&local_4e0);
            testing::internal::AssertHelper::~AssertHelper(&local_4e8);
            std::__cxx11::string::~string((string *)&gtest_ar.message_);
            testing::Message::~Message(&local_4e0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d0);
          if (bVar1) {
            local_520[1] = 1;
            local_520[0] = FileDescriptor::message_type_count
                                     ((FileDescriptor *)
                                      gtest_ar__4.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl);
            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                      ((EqHelper *)local_518,"1","file->message_type_count()",local_520 + 1,
                       local_520);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_518);
            if (!bVar1) {
              testing::Message::Message(&local_528);
              pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_518);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&options,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                         ,0x1033,pcVar4);
              testing::internal::AssertHelper::operator=((AssertHelper *)&options,&local_528);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&options);
              testing::Message::~Message(&local_528);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_518);
            if (bVar1) {
              pDVar2 = FileDescriptor::message_type
                                 ((FileDescriptor *)
                                  gtest_ar__4.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl,0);
              gtest_ar_1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )Descriptor::options(pDVar2);
              local_54c = 0x4d2;
              this_00 = MessageOptions::
                        GetExtension<google::protobuf::internal::MessageTypeTraits<proto2_unittest::ComplexOptionType1>,_(unsigned_char)__v_,_false,_0>
                                  ((MessageOptions *)
                                   gtest_ar_1.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl,
                                   (ExtensionIdentifier<google::protobuf::MessageOptions,_google::protobuf::internal::MessageTypeTraits<proto2_unittest::ComplexOptionType1>,_(unsigned_char)__v_,_false>
                                    *)proto2_unittest::complex_opt1);
              local_550 = proto2_unittest::ComplexOptionType1::foo(this_00);
              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                        ((EqHelper *)local_548,"1234",
                         "options.GetExtension(proto2_unittest::complex_opt1).foo()",&local_54c,
                         &local_550);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_548);
              if (!bVar1) {
                testing::Message::Message(&local_558);
                pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_548);
                testing::internal::AssertHelper::AssertHelper
                          (&local_560,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                           ,0x1036,pcVar4);
                testing::internal::AssertHelper::operator=(&local_560,&local_558);
                testing::internal::AssertHelper::~AssertHelper(&local_560);
                testing::Message::~Message(&local_558);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_548);
            }
          }
        }
      }
      FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&gtest_ar__2.message_);
    }
  }
  DescriptorPool::~DescriptorPool((DescriptorPool *)((long)&file_proto_1.field_0 + 0xe0));
  return;
}

Assistant:

TEST(CustomOptions, MessageOptionThreeFieldsSet) {
  // This tests a bug which previously existed in custom options parsing.  The
  // bug occurred when you defined a custom option with message type and then
  // set three fields of that option on a single definition (see the example
  // below).  The bug is a bit hard to explain, so check the change history if
  // you want to know more.
  DescriptorPool pool;

  {
    FileDescriptorProto file_proto;
    FileDescriptorProto::descriptor()->file()->CopyTo(&file_proto);
    ASSERT_TRUE(pool.BuildFile(file_proto) != nullptr);
  }
  {
    FileDescriptorProto any_proto;
    google::protobuf::Any::descriptor()->file()->CopyTo(&any_proto);
    ASSERT_TRUE(pool.BuildFile(any_proto) != nullptr);
  }
  FileDescriptorProto file_proto;
  proto2_unittest::TestMessageWithCustomOptions::descriptor()->file()->CopyTo(
      &file_proto);
  ASSERT_TRUE(pool.BuildFile(file_proto) != nullptr);

  // The following represents the definition:
  //
  //   import "google/protobuf/unittest_custom_options.proto"
  //   package proto2_unittest;
  //   message Foo {
  //     option (complex_opt1).foo  = 1234;
  //     option (complex_opt1).foo2 = 1234;
  //     option (complex_opt1).foo3 = 1234;
  //   }
  ASSERT_TRUE(TextFormat::ParseFromString(
      "name: \"custom_options_import.proto\" "
      "package: \"proto2_unittest\" "
      "dependency: \"google/protobuf/unittest_custom_options.proto\" "
      "message_type { "
      "  name: \"Foo\" "
      "  options { "
      "    uninterpreted_option { "
      "      name { "
      "        name_part: \"complex_opt1\" "
      "        is_extension: true "
      "      } "
      "      name { "
      "        name_part: \"foo\" "
      "        is_extension: false "
      "      } "
      "      positive_int_value: 1234 "
      "    } "
      "    uninterpreted_option { "
      "      name { "
      "        name_part: \"complex_opt1\" "
      "        is_extension: true "
      "      } "
      "      name { "
      "        name_part: \"foo2\" "
      "        is_extension: false "
      "      } "
      "      positive_int_value: 1234 "
      "    } "
      "    uninterpreted_option { "
      "      name { "
      "        name_part: \"complex_opt1\" "
      "        is_extension: true "
      "      } "
      "      name { "
      "        name_part: \"foo3\" "
      "        is_extension: false "
      "      } "
      "      positive_int_value: 1234 "
      "    } "
      "  } "
      "}",
      &file_proto));

  const FileDescriptor* file = pool.BuildFile(file_proto);
  ASSERT_TRUE(file != nullptr);
  ASSERT_EQ(1, file->message_type_count());

  const MessageOptions& options = file->message_type(0)->options();
  EXPECT_EQ(1234, options.GetExtension(proto2_unittest::complex_opt1).foo());
}